

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

IRType lj_opt_narrow_forl(jit_State *J,cTValue *tv)

{
  double dVar1;
  double dVar2;
  
  if ((J->flags & 0x200000) != 0) {
    dVar1 = tv->n;
    if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      dVar1 = tv[1].n;
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        dVar2 = tv[2].n;
        if ((dVar2 == (double)(int)dVar2) && (!NAN(dVar2) && !NAN((double)(int)dVar2))) {
          if (0.0 <= dVar2) {
            if (dVar1 + dVar2 <= 2147483647.0) {
              return IRT_IGC;
            }
          }
          else if (-2147483648.0 <= dVar1 + dVar2) {
            return IRT_IGC;
          }
        }
      }
    }
  }
  return IRT_NUM;
}

Assistant:

IRType lj_opt_narrow_forl(jit_State *J, cTValue *tv)
{
  lj_assertJ(tvisnumber(&tv[FORL_IDX]) &&
	     tvisnumber(&tv[FORL_STOP]) &&
	     tvisnumber(&tv[FORL_STEP]),
	     "expected number types");
  /* Narrow only if the runtime values of start/stop/step are all integers. */
  if (narrow_forl(J, &tv[FORL_IDX]) &&
      narrow_forl(J, &tv[FORL_STOP]) &&
      narrow_forl(J, &tv[FORL_STEP])) {
    /* And if the loop index can't possibly overflow. */
    lua_Number step = numberVnum(&tv[FORL_STEP]);
    lua_Number sum = numberVnum(&tv[FORL_STOP]) + step;
    if (0 <= step ? (sum <= 2147483647.0) : (sum >= -2147483648.0))
      return IRT_INT;
  }
  return IRT_NUM;
}